

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanlineAdapterTests.cpp
# Opt level: O2

string * agge::tests::ScanlineAdapterTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ScanlineAdapterTests.cpp"
             ,&local_89);
  std::__cxx11::string::string((string *)&local_68,"28",&local_8a);
  std::operator+(&local_28,&local_48,&local_68);
  std::__cxx11::string::string((string *)&local_88,"ScanlineAdapterTests",&local_8b);
  std::operator+(in_RDI,&local_28,&local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

test( ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction )
			{
				// INIT
				mocks::renderer_adapter<> r1;
				raw_memory_object b1;

				mocks::renderer_adapter<uint16_t> r2;
				raw_memory_object b2;

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl1(r1, b1, 11);
				scanline_adapter< mocks::renderer_adapter<uint16_t> > sl2(r2, b2, 17);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 11 + 4));
				assert_is_true(enough_capacity<uint16_t>(b2, 17 + 4));

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl3(r1, b1, 1311);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 1311 + 4));
			}